

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O3

dgEdge * __thiscall
dgPolyhedra::FindEarTip
          (dgPolyhedra *this,dgEdge *face,HaF64 *pool,HaI32 stride,
          dgDownHeap<dgEdge_*,_double> *heap,dgBigVector *normal)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  dgEdge *pdVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  dgTreeNode *pdVar11;
  ulong uVar12;
  long lVar13;
  dgEdge *pdVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  dgEdge *ptr;
  dgEdge *local_88;
  dgPolyhedra *local_80;
  double local_78;
  double local_70;
  ulong local_68;
  double local_60;
  double local_58;
  ulong local_50;
  undefined1 local_48 [16];
  
  lVar13 = (long)stride;
  lVar8 = face->m_prev->m_incidentVertex * lVar13;
  local_88 = face;
  local_80 = this;
  if ((ulong)ABS((double)pool[lVar8]) < 0x7ff0000000000000) {
    auVar18 = *(undefined1 (*) [16])(pool + lVar8 + 1);
    auVar16._8_8_ = 0x7fffffffffffffff;
    auVar16._0_8_ = 0x7fffffffffffffff;
    auVar16 = vpandq_avx512vl(auVar18,auVar16);
    auVar17._8_8_ = 0x7fefffffffffffff;
    auVar17._0_8_ = 0x7fefffffffffffff;
    uVar10 = vpcmpgtq_avx512vl(auVar16,auVar17);
    if (((((uVar10 & 1) == 0) && (!NAN(auVar18._0_8_))) && ((uVar10 & 3) >> 1 == 0)) &&
       (!NAN((double)pool[lVar8 + 2]))) {
      lVar9 = face->m_incidentVertex * lVar13;
      dVar1 = (double)pool[lVar9];
      if ((ulong)ABS(dVar1) < 0x7ff0000000000000) {
        auVar16 = *(undefined1 (*) [16])(pool + lVar9 + 1);
        auVar19._8_8_ = 0x7fffffffffffffff;
        auVar19._0_8_ = 0x7fffffffffffffff;
        auVar17 = vpandq_avx512vl(auVar16,auVar19);
        auVar20._8_8_ = 0x7fefffffffffffff;
        auVar20._0_8_ = 0x7fefffffffffffff;
        uVar10 = vpcmpgtq_avx512vl(auVar17,auVar20);
        if ((((uVar10 & 1) == 0) && (!NAN(auVar16._0_8_))) &&
           (((uVar10 & 3) >> 1 == 0 && (!NAN((double)pool[lVar9 + 2]))))) {
          dVar6 = dVar1 - (double)pool[lVar8];
          if ((long)ABS(dVar6) < 0x7ff0000000000000) {
            auVar18 = vsubpd_avx(auVar16,auVar18);
            auVar21._8_8_ = 0x7fffffffffffffff;
            auVar21._0_8_ = 0x7fffffffffffffff;
            auVar17 = vandpd_avx512vl(auVar18,auVar21);
            auVar22._8_8_ = 0x7fefffffffffffff;
            auVar22._0_8_ = 0x7fefffffffffffff;
            uVar10 = vpcmpgtq_avx512vl(auVar17,auVar22);
            if (((uVar10 & 1) == 0) && ((uVar10 & 3) >> 1 == 0)) {
              dVar40 = auVar18._0_8_;
              auVar17 = vshufpd_avx(auVar18,auVar18,1);
              auVar23._8_8_ = 0;
              auVar23._0_8_ = dVar6;
              auVar24._8_8_ = 0;
              auVar24._0_8_ = dVar40 * dVar40;
              auVar19 = vfmadd231sd_fma(auVar24,auVar23,auVar23);
              auVar17 = vfmadd213sd_fma(auVar17,auVar17,auVar19);
              auVar17 = vsqrtsd_avx(auVar17,auVar17);
              auVar17 = vmaxsd_avx(ZEXT816(0x3ddb7cdfe0000000),auVar17);
              auVar25._0_8_ = 1.0 / auVar17._0_8_;
              auVar25._8_8_ = 0x3ff0000000000000;
              auVar17 = vmulsd_avx512f(auVar23,auVar25);
              auVar57 = ZEXT1664(auVar17);
              if ((auVar17._0_8_ & 0x7fffffffffffffff) < 0x7ff0000000000000) {
                auVar27._0_8_ = dVar40 * auVar25._0_8_;
                auVar27._8_8_ = auVar18._8_8_ * auVar25._0_8_;
                auVar18._8_8_ = 0x7fffffffffffffff;
                auVar18._0_8_ = 0x7fffffffffffffff;
                auVar18 = vandpd_avx512vl(auVar27,auVar18);
                auVar26._8_8_ = 0x7fefffffffffffff;
                auVar26._0_8_ = 0x7fefffffffffffff;
                uVar10 = vpcmpgtq_avx512vl(auVar18,auVar26);
                if (((uVar10 & 1) == 0) && ((uVar10 & 3) >> 1 == 0)) {
                  auVar28 = ZEXT816(0x4024000000000000);
                  auVar45 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
                  auVar47 = ZEXT1664(CONCAT88(0x7fefffffffffffff,0x7fefffffffffffff));
                  auVar29 = vshufpd_avx(auVar27,auVar27,1);
                  local_88 = face;
                  do {
                    pdVar14 = local_88->m_next;
                    lVar8 = pdVar14->m_incidentVertex * lVar13;
                    dVar6 = (double)pool[lVar8];
                    if (0x7fefffffffffffff < (ulong)ABS(dVar6)) goto LAB_0085ce7f;
                    auVar18 = *(undefined1 (*) [16])(pool + lVar8 + 1);
                    auVar17 = vpand_avx(auVar18,auVar45._0_16_);
                    uVar10 = vpcmpgtq_avx512vl(auVar17,auVar47._0_16_);
                    if (((((uVar10 & 1) != 0) || (NAN(auVar18._0_8_))) || ((uVar10 & 3) >> 1 != 0))
                       || (NAN((double)pool[lVar8 + 2]))) goto LAB_0085ce7f;
                    dVar1 = dVar6 - dVar1;
                    if (0x7fefffffffffffff < (long)ABS(dVar1)) goto LAB_0085ce60;
                    auVar17 = vsubpd_avx(auVar18,auVar16);
                    auVar16 = vandpd_avx(auVar17,auVar45._0_16_);
                    uVar10 = vpcmpgtq_avx512vl(auVar16,auVar47._0_16_);
                    if (((uVar10 & 1) != 0) || ((uVar10 & 3) >> 1 != 0)) goto LAB_0085ce60;
                    auVar19 = vshufpd_avx(auVar17,auVar17,1);
                    auVar30._8_8_ = 0;
                    auVar30._0_8_ = dVar1;
                    auVar31._8_8_ = 0;
                    auVar31._0_8_ = auVar17._0_8_ * auVar17._0_8_;
                    auVar16 = vfmadd231sd_fma(auVar31,auVar30,auVar30);
                    auVar16 = vfmadd231sd_fma(auVar16,auVar19,auVar19);
                    auVar16 = vsqrtsd_avx(auVar16,auVar16);
                    auVar32._0_4_ = (float)auVar16._0_8_;
                    auVar32._4_12_ = auVar16._4_12_;
                    auVar16 = vmaxss_avx(SUB6416(ZEXT464(0x2edbe6ff),0),auVar32);
                    auVar33._0_8_ = (double)(1.0 / auVar16._0_4_);
                    auVar33._8_8_ = 0;
                    auVar17 = vmulsd_avx512f(auVar17,auVar33);
                    dVar40 = dVar1 * auVar33._0_8_;
                    dVar5 = auVar19._0_8_ * auVar33._0_8_;
                    if ((0x7fefffffffffffff < (long)ABS(dVar40)) ||
                       ((0x7fefffffffffffff < (auVar17._0_8_ & 0x7fffffffffffffff) ||
                        (0x7fefffffffffffff < (long)ABS(dVar5))))) goto LAB_0085ce60;
                    auVar42._8_8_ = 0;
                    auVar42._0_8_ = dVar5;
                    auVar16 = vmulsd_avx512f(auVar42,auVar57._0_16_);
                    auVar19 = vmulsd_avx512f(auVar17,auVar29);
                    auVar51._8_8_ = 0;
                    auVar51._0_8_ = dVar40;
                    auVar16 = vfmsub231sd_fma(auVar16,auVar51,auVar29);
                    auVar19 = vfmsub231sd_fma(auVar19,auVar27,auVar42);
                    auVar35._8_8_ = 0;
                    auVar35._0_8_ = dVar40 * auVar27._0_8_;
                    auVar20 = vfmsub231sd_avx512f(auVar35,auVar17,auVar57._0_16_);
                    if ((0x7fefffffffffffff < (auVar19._0_8_ & 0x7fffffffffffffff)) ||
                       ((0x7fefffffffffffff < (ulong)ABS(auVar16._0_8_) ||
                        (0x7fefffffffffffff < (auVar20._0_8_ & 0x7fffffffffffffff)))))
                    goto LAB_0085ce60;
                    auVar2._8_8_ = 0;
                    auVar2._0_8_ = (normal->super_dgTemplateVector<double>).m_x;
                    auVar38._8_8_ = 0;
                    auVar38._0_8_ = auVar16._0_8_ * (normal->super_dgTemplateVector<double>).m_y;
                    auVar16 = vfmadd132sd_fma(auVar19,auVar38,auVar2);
                    auVar3._8_8_ = 0;
                    auVar3._0_8_ = (normal->super_dgTemplateVector<double>).m_z;
                    auVar36 = vfmadd132sd_fma(auVar20,auVar16,auVar3);
                    dVar34 = auVar36._0_8_;
                    auVar16 = auVar18;
                    dVar1 = dVar6;
                    auVar27 = auVar17;
                    if (0.0 <= dVar34) {
                      local_50 = auVar28._0_8_;
                      vmovsd_avx512f(auVar17);
                      local_78 = dVar34;
                      local_70 = dVar5;
                      local_60 = dVar40;
                      local_58 = dVar6;
                      local_48 = auVar18;
                      dgDownHeap<dgEdge_*,_double>::Push(heap,&local_88,dVar34);
                      auVar36._8_8_ = 0;
                      auVar36._0_8_ = local_78;
                      auVar27._8_8_ = 0.0;
                      auVar27._0_8_ = (double)local_68;
                      auVar28._8_8_ = 0;
                      auVar28._0_8_ = local_50;
                      auVar47 = ZEXT1664(CONCAT88(0x7fefffffffffffff,0x7fefffffffffffff));
                      auVar45 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
                      pdVar14 = local_88->m_next;
                      auVar16 = local_48;
                      dVar40 = local_60;
                      dVar5 = local_70;
                      dVar1 = local_58;
                    }
                    auVar29._8_8_ = 0;
                    auVar29._0_8_ = dVar5;
                    auVar28 = vminsd_avx(auVar36,auVar28);
                    auVar57 = ZEXT864((ulong)dVar40);
                    local_88 = pdVar14;
                  } while (pdVar14 != face);
                  iVar7 = (heap->super_dgHeapBase<dgEdge_*,_double>).m_curCount;
                  if (auVar28._0_8_ <= 0.10000000149011612) {
                    if (iVar7 != 0) {
LAB_0085c9dd:
                      if (-1 < iVar7) {
                        pdVar14 = *(dgEdge **)
                                   ((heap->super_dgHeapBase<dgEdge_*,_double>).m_pool + 8);
                        dgDownHeap<dgEdge_*,_double>::Pop(heap);
                        pdVar4 = pdVar14->m_prev;
                        auVar18 = vpbroadcastq_avx512vl(ZEXT816(0x7fffffffffffffff));
                        auVar16 = vpbroadcastq_avx512vl(ZEXT816(0x7fefffffffffffff));
                        uVar10 = (ulong)pdVar14->m_next->m_incidentVertex;
                        pdVar11 = (local_80->super_dgTree<dgEdge,_long>).m_head;
                        if (pdVar11 != (dgTreeNode *)0x0) {
                          uVar12 = (long)pdVar4->m_incidentVertex << 0x20 | uVar10;
                          do {
                            lVar8 = 8;
                            if ((pdVar11->m_key <= (long)uVar12) &&
                               (lVar8 = 0x10, (long)uVar12 <= pdVar11->m_key)) goto LAB_0085ce3a;
                            pdVar11 = *(dgTreeNode **)
                                       ((long)&(pdVar11->super_dgRedBackNode)._vptr_dgRedBackNode +
                                       lVar8);
                          } while (pdVar11 != (dgTreeNode *)0x0);
                        }
                        lVar8 = pdVar4->m_incidentVertex * lVar13;
                        dVar1 = (double)pool[lVar8];
                        if ((ulong)ABS(dVar1) < 0x7ff0000000000000) {
                          auVar17 = *(undefined1 (*) [16])(pool + lVar8 + 1);
                          auVar19 = vpandq_avx512vl(auVar17,auVar18);
                          uVar12 = vpcmpgtq_avx512vl(auVar19,auVar16);
                          if (((((uVar12 & 1) == 0) && (!NAN(auVar17._0_8_))) &&
                              ((uVar12 & 3) >> 1 == 0)) &&
                             (auVar39._8_8_ = 0, auVar39._0_8_ = pool[lVar8 + 2],
                             !NAN((double)pool[lVar8 + 2]))) {
                            lVar8 = pdVar14->m_incidentVertex * lVar13;
                            dVar6 = (double)pool[lVar8];
                            if ((ulong)ABS(dVar6) < 0x7ff0000000000000) {
                              auVar19 = *(undefined1 (*) [16])(pool + lVar8 + 1);
                              auVar20 = vpandq_avx512vl(auVar19,auVar18);
                              uVar12 = vpcmpgtq_avx512vl(auVar20,auVar16);
                              if ((((uVar12 & 1) == 0) && (!NAN(auVar19._0_8_))) &&
                                 (((uVar12 & 3) >> 1 == 0 &&
                                  (auVar43._8_8_ = 0, auVar43._0_8_ = pool[lVar8 + 2],
                                  !NAN((double)pool[lVar8 + 2]))))) {
                                lVar8 = uVar10 * lVar13;
                                dVar40 = (double)pool[lVar8];
                                if ((ulong)ABS(dVar40) < 0x7ff0000000000000) {
                                  auVar20 = *(undefined1 (*) [16])(pool + lVar8 + 1);
                                  auVar21 = vpandq_avx512vl(auVar20,auVar18);
                                  uVar10 = vpcmpgtq_avx512vl(auVar21,auVar16);
                                  if ((((uVar10 & 1) == 0) && (!NAN(auVar20._0_8_))) &&
                                     (((uVar10 & 3) >> 1 == 0 &&
                                      (auVar46._8_8_ = 0, auVar46._0_8_ = pool[lVar8 + 2],
                                      !NAN((double)pool[lVar8 + 2]))))) {
                                    if ((long)ABS(dVar6 - dVar1) < 0x7ff0000000000000) {
                                      auVar21 = vsubpd_avx(auVar19,auVar17);
                                      auVar22 = vandpd_avx512vl(auVar21,auVar18);
                                      uVar10 = vpcmpgtq_avx512vl(auVar22,auVar16);
                                      if ((((uVar10 & 1) == 0) && ((uVar10 & 3) >> 1 == 0)) &&
                                         ((long)ABS(dVar40 - dVar6) < 0x7ff0000000000000)) {
                                        auVar22 = vsubpd_avx(auVar20,auVar19);
                                        auVar23 = vandpd_avx512vl(auVar22,auVar18);
                                        uVar10 = vpcmpgtq_avx512vl(auVar23,auVar16);
                                        if ((((uVar10 & 1) == 0) && ((uVar10 & 3) >> 1 == 0)) &&
                                           ((long)ABS(dVar1 - dVar40) < 0x7ff0000000000000)) {
                                          auVar23 = vsubpd_avx(auVar17,auVar20);
                                          auVar24 = vandpd_avx512vl(auVar23,auVar18);
                                          uVar10 = vpcmpgtq_avx512vl(auVar24,auVar16);
                                          if (((uVar10 & 1) == 0) && ((uVar10 & 3) >> 1 == 0)) {
                                            local_88 = pdVar14->m_next->m_next;
                                            if (local_88 == pdVar4) {
                                              return pdVar14;
                                            }
                                            auVar52._8_8_ = 0;
                                            auVar52._0_8_ =
                                                 (normal->super_dgTemplateVector<double>).m_x;
                                            dVar5 = (normal->super_dgTemplateVector<double>).m_y;
                                            dVar34 = (normal->super_dgTemplateVector<double>).m_z;
                                            auVar24 = vshufpd_avx512vl(auVar23,auVar23,1);
                                            auVar25 = vshufpd_avx512vl(auVar22,auVar22,1);
                                            auVar26 = vshufpd_avx512vl(auVar21,auVar21,1);
                                            do {
                                              lVar8 = local_88->m_incidentVertex * lVar13;
                                              if (0x7fefffffffffffff <
                                                  (ulong)ABS((double)pool[lVar8]))
                                              goto LAB_0085ce7f;
                                              auVar27 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                                            (pool + lVar8 + 1));
                                              auVar28 = vpandq_avx512vl(auVar27,auVar18);
                                              uVar10 = vpcmpgtq_avx512vl(auVar28,auVar16);
                                              if (((uVar10 & 1) != 0) ||
                                                 (auVar27 = vucomisd_avx512f(auVar27),
                                                 (uVar10 & 1) == 0)) goto LAB_0085ce7f;
                                              uVar10 = (uVar10 & 3) >> 1;
                                              bVar15 = uVar10 != 0;
                                              if ((bVar15) ||
                                                 (auVar59._8_8_ = 0, auVar59._0_8_ = pool[lVar8 + 2]
                                                 , auVar28 = vucomisd_avx512f(auVar59), uVar10 == 0)
                                                 ) goto LAB_0085ce7f;
                                              auVar37._8_8_ = 0;
                                              auVar37._0_8_ = dVar1;
                                              auVar58._8_8_ = 0;
                                              auVar58._0_8_ = pool[lVar8];
                                              auVar29 = vsubsd_avx512f(auVar58,auVar37);
                                              auVar30 = vsubsd_avx512f(auVar28,auVar39);
                                              auVar31 = vsubsd_avx512f(auVar27,auVar17);
                                              auVar32 = vmulsd_avx512f(auVar26,auVar29);
                                              auVar33 = vmulsd_avx512f(auVar21,auVar30);
                                              auVar48._8_8_ = 0;
                                              auVar48._0_8_ = dVar6 - dVar1;
                                              auVar30 = vfmsub231sd_avx512f(auVar32,auVar48,auVar30)
                                              ;
                                              auVar32 = vfmsub231sd_avx512f(auVar33,auVar31,auVar26)
                                              ;
                                              auVar31 = vmulsd_avx512f(auVar48,auVar31);
                                              auVar29 = vfmsub231sd_avx512f(auVar31,auVar21,auVar29)
                                              ;
                                              auVar53._8_8_ = 0;
                                              auVar53._0_8_ = dVar5;
                                              auVar30 = vmulsd_avx512f(auVar30,auVar53);
                                              auVar30 = vfmadd231sd_avx512f(auVar30,auVar52,auVar32)
                                              ;
                                              auVar55._8_8_ = 0;
                                              auVar55._0_8_ = dVar34;
                                              auVar29 = vfmadd231sd_avx512f(auVar30,auVar55,auVar29)
                                              ;
                                              vucomisd_avx512f(auVar29);
                                              if (bVar15) {
                                                auVar41._8_8_ = 0;
                                                auVar41._0_8_ = dVar6;
                                                auVar29 = vsubsd_avx512f(auVar58,auVar41);
                                                auVar30 = vsubsd_avx512f(auVar28,auVar43);
                                                auVar31 = vsubsd_avx512f(auVar27,auVar19);
                                                auVar32 = vmulsd_avx512f(auVar25,auVar29);
                                                auVar33 = vmulsd_avx512f(auVar22,auVar30);
                                                auVar49._8_8_ = 0;
                                                auVar49._0_8_ = dVar40 - dVar6;
                                                auVar30 = vfmsub231sd_avx512f(auVar32,auVar49,
                                                                              auVar30);
                                                auVar32 = vfmsub231sd_avx512f(auVar33,auVar31,
                                                                              auVar25);
                                                auVar31 = vmulsd_avx512f(auVar49,auVar31);
                                                auVar29 = vfmsub231sd_avx512f(auVar31,auVar22,
                                                                              auVar29);
                                                auVar30 = vmulsd_avx512f(auVar30,auVar53);
                                                auVar30 = vfmadd231sd_avx512f(auVar30,auVar52,
                                                                              auVar32);
                                                auVar29 = vfmadd231sd_avx512f(auVar30,auVar55,
                                                                              auVar29);
                                                vucomisd_avx512f(auVar29);
                                                if (bVar15) {
                                                  auVar44._8_8_ = 0;
                                                  auVar44._0_8_ = dVar40;
                                                  auVar29 = vsubsd_avx512f(auVar58,auVar44);
                                                  auVar28 = vsubsd_avx512f(auVar28,auVar46);
                                                  auVar27 = vsubsd_avx512f(auVar27,auVar20);
                                                  auVar30 = vmulsd_avx512f(auVar24,auVar29);
                                                  auVar31 = vmulsd_avx512f(auVar23,auVar28);
                                                  auVar50._8_8_ = 0;
                                                  auVar50._0_8_ = dVar1 - dVar40;
                                                  auVar28 = vfmsub231sd_avx512f(auVar30,auVar50,
                                                                                auVar28);
                                                  auVar30 = vfmsub231sd_avx512f(auVar31,auVar27,
                                                                                auVar24);
                                                  auVar27 = vmulsd_avx512f(auVar50,auVar27);
                                                  auVar27 = vfmsub231sd_avx512f(auVar27,auVar23,
                                                                                auVar29);
                                                  auVar54._8_8_ = 0;
                                                  auVar54._0_8_ = dVar5;
                                                  auVar28 = vmulsd_avx512f(auVar28,auVar54);
                                                  auVar28 = vfmadd231sd_avx512f(auVar28,auVar52,
                                                                                auVar30);
                                                  auVar56._8_8_ = 0;
                                                  auVar56._0_8_ = dVar34;
                                                  auVar27 = vfmadd231sd_avx512f(auVar28,auVar56,
                                                                                auVar27);
                                                  vucomisd_avx512f(auVar27);
                                                  if (bVar15) goto LAB_0085ce3a;
                                                }
                                              }
                                              local_88 = local_88->m_next;
                                              if (local_88 == pdVar4) {
                                                return pdVar14;
                                              }
                                            } while( true );
                                          }
                                        }
                                      }
                                    }
                                    goto LAB_0085ce60;
                                  }
                                }
                              }
                            }
                          }
                        }
                        goto LAB_0085ce7f;
                      }
                      goto LAB_0085ce9e;
                    }
                    pdVar14 = (dgEdge *)0x0;
                  }
                  else {
                    if (iVar7 < 0) {
LAB_0085ce9e:
                      __assert_fail("i<= m_curCount",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgHeap.h"
                                    ,0xcd,
                                    "const OBJECT &dgHeapBase<dgEdge *, double>::operator[](hacd::HaI32) const [OBJECT = dgEdge *, KEY = double]"
                                   );
                    }
                    pdVar14 = *(dgEdge **)((heap->super_dgHeapBase<dgEdge_*,_double>).m_pool + 8);
                  }
                  return pdVar14;
                }
              }
            }
          }
LAB_0085ce60:
          __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                        ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
        }
      }
    }
  }
LAB_0085ce7f:
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x152,"dgBigVector::dgBigVector(const hacd::HaF64 *)");
LAB_0085ce3a:
  iVar7 = (heap->super_dgHeapBase<dgEdge_*,_double>).m_curCount;
  if (iVar7 == 0) {
    return pdVar14;
  }
  goto LAB_0085c9dd;
}

Assistant:

dgEdge* dgPolyhedra::FindEarTip (dgEdge* const face, const hacd::HaF64* const pool, hacd::HaI32 stride, dgDownHeap<dgEdge*, hacd::HaF64>& heap, const dgBigVector &normal) const
{
	dgEdge* ptr = face;
	dgBigVector p0 (&pool[ptr->m_prev->m_incidentVertex * stride]);
	dgBigVector p1 (&pool[ptr->m_incidentVertex * stride]);
	dgBigVector d0 (p1 - p0);
	hacd::HaF64 f = sqrt (d0 % d0);
	if (f < hacd::HaF64 (1.0e-10f)) {
		f = hacd::HaF64 (1.0e-10f);
	}
	d0 = d0.Scale (hacd::HaF64 (1.0f) / f);

	hacd::HaF64 minAngle = hacd::HaF32 (10.0f);
	do {
		dgBigVector p2 (&pool [ptr->m_next->m_incidentVertex * stride]);
		dgBigVector d1 (p2 - p1);
		hacd::HaF32 f = dgSqrt (d1 % d1);
		if (f < hacd::HaF32 (1.0e-10f)) {
			f = hacd::HaF32 (1.0e-10f);
		}
		d1 = d1.Scale (hacd::HaF32 (1.0f) / f);
		dgBigVector n (d0 * d1);

		hacd::HaF64 angle = normal %  n;
		if (angle >= hacd::HaF64 (0.0f)) {
			heap.Push (ptr, angle);
		}

		if (angle < minAngle) {
			minAngle = angle;
		}

		d0 = d1;
		p1 = p2;
		ptr = ptr->m_next;
	} while (ptr != face);

	if (minAngle > hacd::HaF32 (0.1f)) {
		return heap[0];
	}

	dgEdge* ear = NULL;
	while (heap.GetCount()) {
		ear = heap[0];
		heap.Pop();

		if (FindEdge (ear->m_prev->m_incidentVertex, ear->m_next->m_incidentVertex)) {
			continue;
		}

		dgBigVector p0 (&pool [ear->m_prev->m_incidentVertex * stride]);
		dgBigVector p1 (&pool [ear->m_incidentVertex * stride]);
		dgBigVector p2 (&pool [ear->m_next->m_incidentVertex * stride]);

		dgBigVector p10 (p1 - p0);
		dgBigVector p21 (p2 - p1);
		dgBigVector p02 (p0 - p2);

		for (ptr = ear->m_next->m_next; ptr != ear->m_prev; ptr = ptr->m_next) {
			dgBigVector p (&pool [ptr->m_incidentVertex * stride]);

			hacd::HaF64 side = ((p - p0) * p10) % normal;
			if (side < hacd::HaF64 (0.05f)) {
				side = ((p - p1) * p21) % normal;
				if (side < hacd::HaF64 (0.05f)) {
					side = ((p - p2) * p02) % normal;
					if (side < hacd::HaF32 (0.05f)) {
						break;
					}
				}
			}
		}

		if (ptr == ear->m_prev) {
			break;
		}
	}

	return ear;
}